

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS
ref_grid_cell_id_nodes
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_INT cell_id,REF_INT *nnode,REF_INT *ncell,
          REF_INT **g2l,REF_INT **l2g)

{
  REF_NODE pRVar1;
  REF_INT *pRVar2;
  bool bVar3;
  REF_STATUS RVar4;
  REF_INT *pRVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  REF_STATUS unaff_R13D;
  int iVar9;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  if (ref_cell->last_node_is_an_id == 0) {
    pcVar8 = "ref_cell with id expected";
    uVar7 = 0x1bf;
    goto LAB_0016aa2c;
  }
  pRVar1 = ref_grid->node;
  if ((long)pRVar1->max < 0) {
    unaff_R13D = 1;
    pcVar8 = "malloc *g2l of REF_INT negative";
LAB_0016a909:
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x1c1,
           "ref_grid_cell_id_nodes",pcVar8);
  }
  else {
    pRVar5 = (REF_INT *)malloc((long)pRVar1->max << 2);
    *g2l = pRVar5;
    if (pRVar5 == (REF_INT *)0x0) {
      unaff_R13D = 2;
      pcVar8 = "malloc *g2l of REF_INT NULL";
      goto LAB_0016a909;
    }
    bVar3 = true;
    if (0 < pRVar1->max) {
      lVar6 = 0;
      do {
        pRVar5[lVar6] = -1;
        lVar6 = lVar6 + 1;
      } while (lVar6 < pRVar1->max);
    }
  }
  if (!bVar3) {
    return unaff_R13D;
  }
  iVar9 = 0;
  *nnode = 0;
  *ncell = 0;
  if (0 < ref_cell->max) {
    do {
      RVar4 = ref_cell_nodes(ref_cell,iVar9,local_a8);
      if (((RVar4 == 0) && (local_a8[ref_cell->node_per] == cell_id)) &&
         (*ncell = *ncell + 1, 0 < ref_cell->node_per)) {
        pRVar5 = *g2l;
        lVar6 = 0;
        do {
          if (pRVar5[local_a8[lVar6]] == -1) {
            pRVar5[local_a8[lVar6]] = *nnode;
            *nnode = *nnode + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < ref_cell->node_per);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < ref_cell->max);
  }
  if (-1 < (long)*nnode) {
    pRVar5 = (REF_INT *)malloc((long)*nnode << 2);
    *l2g = pRVar5;
    if (pRVar5 != (REF_INT *)0x0) {
      *nnode = 0;
      if (0 < pRVar1->max) {
        pRVar2 = *g2l;
        lVar6 = 0;
        do {
          if (pRVar2[lVar6] != -1) {
            pRVar2[lVar6] = *nnode;
            iVar9 = *nnode;
            pRVar5[iVar9] = (REF_INT)lVar6;
            *nnode = iVar9 + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < pRVar1->max);
      }
      return 0;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x1d2,
           "ref_grid_cell_id_nodes","malloc *l2g of REF_INT NULL");
    return 2;
  }
  pcVar8 = "malloc *l2g of REF_INT negative";
  uVar7 = 0x1d2;
LAB_0016aa2c:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar7,
         "ref_grid_cell_id_nodes",pcVar8);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_cell_id_nodes(REF_GRID ref_grid, REF_CELL ref_cell,
                                          REF_INT cell_id, REF_INT *nnode,
                                          REF_INT *ncell, REF_INT **g2l,
                                          REF_INT **l2g) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell, node, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RAS(ref_cell_last_node_is_an_id(ref_cell), "ref_cell with id expected");

  ref_malloc_init(*g2l, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  (*nnode) = 0;
  (*ncell) = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_malloc(*l2g, *nnode, REF_INT);

  (*nnode) = 0;
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != (*g2l)[node]) {
      (*g2l)[node] = (*nnode);
      (*l2g)[(*nnode)] = node;
      (*nnode)++;
    }
  }

  return REF_SUCCESS;
}